

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testItemDataTransParent(tst_RoleMaskProxyModel *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QStandardItemModel *pQVar4;
  ModelTest *this_00;
  QVariant local_370;
  int local_34c;
  QVariant local_348;
  QVariant local_328;
  int local_304;
  QVariant local_300;
  qint32 local_2dc;
  size_type_conflict local_2d8;
  undefined1 local_2d0 [44];
  int local_2a4;
  QVariant local_2a0;
  QVariant local_280;
  int local_25c;
  QVariant local_258;
  QVariant local_238;
  int local_214;
  QVariant local_210;
  qint32 local_1ec;
  size_type_conflict local_1e8;
  undefined1 local_1e0 [40];
  QModelIndex local_1b8;
  undefined1 local_1a0 [8];
  QModelIndex proxyIdx;
  RoleMaskProxyModel proxyModel;
  QVariant local_170;
  int local_14c;
  QVariant local_148;
  QVariant local_128;
  int local_104;
  QVariant local_100;
  undefined4 local_e0;
  qint32 local_dc;
  size_type_conflict local_d8;
  QMap<int,_QVariant> local_d0;
  QMap<int,_QVariant> itemData;
  QVariant local_a8;
  QModelIndex local_88;
  undefined1 local_70 [8];
  QModelIndex baseIdx;
  QModelIndex local_40;
  QStandardItemModel *local_18;
  QAbstractItemModel *baseModel;
  tst_RoleMaskProxyModel *this_local;
  
  baseModel = (QAbstractItemModel *)this;
  pQVar4 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(pQVar4,&this->super_QObject);
  local_18 = pQVar4;
  QModelIndex::QModelIndex(&local_40);
  QAbstractItemModel::insertRow((QAbstractItemModel *)pQVar4,0,&local_40);
  pQVar4 = local_18;
  QModelIndex::QModelIndex((QModelIndex *)&baseIdx.m);
  QAbstractItemModel::insertColumn((QAbstractItemModel *)pQVar4,0,(QModelIndex *)&baseIdx.m);
  pQVar4 = local_18;
  QModelIndex::QModelIndex(&local_88);
  (**(code **)(*(long *)pQVar4 + 0x60))(local_70,pQVar4,0,0,&local_88);
  pQVar4 = local_18;
  QVariant::QVariant(&local_a8,1);
  bVar1 = (**(code **)(*(long *)pQVar4 + 0x98))(pQVar4,local_70,&local_a8,0x100);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"baseModel->setData(baseIdx, 1, Qt::UserRole)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x4f);
  QVariant::~QVariant(&local_a8);
  pQVar4 = local_18;
  if (((bVar1 ^ 0xff) & 1) == 0) {
    QVariant::QVariant((QVariant *)&itemData,2);
    bVar1 = (**(code **)(*(long *)pQVar4 + 0x98))(pQVar4,local_70,(QVariant *)&itemData,0x101);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"baseModel->setData(baseIdx, 2, Qt::UserRole + 1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x50);
    QVariant::~QVariant((QVariant *)&itemData);
    if (((bVar1 ^ 0xff) & 1) == 0) {
      (**(code **)(*(long *)local_18 + 0xb0))(&local_d0,local_18,local_70);
      local_d8 = QMap<int,_QVariant>::size(&local_d0);
      local_dc = 2;
      bVar2 = QTest::qCompare<long_long,int>
                        (&local_d8,&local_dc,"itemData.size()","2",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x52);
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        local_104 = 0x100;
        QVariant::QVariant(&local_128);
        QMap<int,_QVariant>::value(&local_100,&local_d0,&local_104,&local_128);
        iVar3 = QVariant::toInt((bool *)&local_100);
        bVar1 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x53);
        QVariant::~QVariant(&local_100);
        QVariant::~QVariant(&local_128);
        if (((bVar1 ^ 0xff) & 1) == 0) {
          local_14c = 0x101;
          QVariant::QVariant(&local_170);
          QMap<int,_QVariant>::value(&local_148,&local_d0,&local_14c,&local_170);
          iVar3 = QVariant::toInt((bool *)&local_148);
          bVar1 = QTest::qCompare(iVar3,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x54);
          QVariant::~QVariant(&local_148);
          QVariant::~QVariant(&local_170);
          if (((bVar1 ^ 0xff) & 1) == 0) {
            RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&proxyIdx.m,(QObject *)0x0)
            ;
            this_00 = (ModelTest *)operator_new(0x10);
            ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyIdx.m,(QObject *)local_18);
            RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyIdx.m);
            RoleMaskProxyModel::addMaskedRole((int)&proxyIdx + 0x10);
            RoleMaskProxyModel::addMaskedRole((int)&proxyIdx + 0x10);
            QModelIndex::QModelIndex(&local_1b8);
            QIdentityProxyModel::index((int)local_1a0,(int)&proxyIdx + 0x10,(QModelIndex *)0x0);
            QVariant::QVariant((QVariant *)(local_1e0 + 8),200);
            bVar1 = RoleMaskProxyModel::setData
                              ((QModelIndex *)&proxyIdx.m,(QVariant *)local_1a0,(int)local_1e0 + 8);
            bVar1 = QTest::qVerify((bool)(bVar1 & 1),
                                   "proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                   ,0x5b);
            QVariant::~QVariant((QVariant *)(local_1e0 + 8));
            if (((bVar1 ^ 0xff) & 1) == 0) {
              RoleMaskProxyModel::setTransparentIfEmpty((bool)((char)&proxyIdx + '\x10'));
              RoleMaskProxyModel::itemData((QModelIndex *)local_1e0);
              QMap<int,_QVariant>::operator=(&local_d0,(QMap<int,_QVariant> *)local_1e0);
              QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)local_1e0);
              local_1e8 = QMap<int,_QVariant>::size(&local_d0);
              local_1ec = 3;
              bVar2 = QTest::qCompare<long_long,int>
                                (&local_1e8,&local_1ec,"itemData.size()","3",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                 ,0x5e);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                local_214 = 0x100;
                QVariant::QVariant(&local_238);
                QMap<int,_QVariant>::value(&local_210,&local_d0,&local_214,&local_238);
                iVar3 = QVariant::toInt((bool *)&local_210);
                bVar1 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x5f);
                QVariant::~QVariant(&local_210);
                QVariant::~QVariant(&local_238);
                if (((bVar1 ^ 0xff) & 1) == 0) {
                  local_25c = 0x102;
                  QVariant::QVariant(&local_280);
                  QMap<int,_QVariant>::value(&local_258,&local_d0,&local_25c,&local_280);
                  iVar3 = QVariant::toInt((bool *)&local_258);
                  bVar1 = QTest::qCompare(iVar3,200,"itemData.value(Qt::UserRole + 2).toInt()","200"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0x60);
                  QVariant::~QVariant(&local_258);
                  QVariant::~QVariant(&local_280);
                  if (((bVar1 ^ 0xff) & 1) == 0) {
                    local_2a4 = 0x101;
                    QVariant::QVariant((QVariant *)(local_2d0 + 8));
                    QMap<int,_QVariant>::value
                              (&local_2a0,&local_d0,&local_2a4,(QVariant *)(local_2d0 + 8));
                    iVar3 = QVariant::toInt((bool *)&local_2a0);
                    bVar1 = QTest::qCompare(iVar3,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                            ,0x61);
                    QVariant::~QVariant(&local_2a0);
                    QVariant::~QVariant((QVariant *)(local_2d0 + 8));
                    if (((bVar1 ^ 0xff) & 1) == 0) {
                      RoleMaskProxyModel::setTransparentIfEmpty((bool)((char)&proxyIdx + '\x10'));
                      RoleMaskProxyModel::itemData((QModelIndex *)local_2d0);
                      QMap<int,_QVariant>::operator=(&local_d0,(QMap<int,_QVariant> *)local_2d0);
                      QMap<int,_QVariant>::~QMap((QMap<int,_QVariant> *)local_2d0);
                      local_2d8 = QMap<int,_QVariant>::size(&local_d0);
                      local_2dc = 2;
                      bVar2 = QTest::qCompare<long_long,int>
                                        (&local_2d8,&local_2dc,"itemData.size()","2",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                         ,100);
                      if (((bVar2 ^ 0xffU) & 1) == 0) {
                        local_304 = 0x100;
                        QVariant::QVariant(&local_328);
                        QMap<int,_QVariant>::value(&local_300,&local_d0,&local_304,&local_328);
                        iVar3 = QVariant::toInt((bool *)&local_300);
                        bVar1 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x65);
                        QVariant::~QVariant(&local_300);
                        QVariant::~QVariant(&local_328);
                        if (((bVar1 ^ 0xff) & 1) == 0) {
                          local_34c = 0x102;
                          QVariant::QVariant(&local_370);
                          QMap<int,_QVariant>::value(&local_348,&local_d0,&local_34c,&local_370);
                          iVar3 = QVariant::toInt((bool *)&local_348);
                          bVar1 = QTest::qCompare(iVar3,200,
                                                  "itemData.value(Qt::UserRole + 2).toInt()","200",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x66);
                          QVariant::~QVariant(&local_348);
                          QVariant::~QVariant(&local_370);
                          if (((bVar1 ^ 0xff) & 1) == 0) {
                            QObject::deleteLater();
                            local_e0 = 0;
                          }
                          else {
                            local_e0 = 1;
                          }
                        }
                        else {
                          local_e0 = 1;
                        }
                      }
                      else {
                        local_e0 = 1;
                      }
                    }
                    else {
                      local_e0 = 1;
                    }
                  }
                  else {
                    local_e0 = 1;
                  }
                }
                else {
                  local_e0 = 1;
                }
              }
              else {
                local_e0 = 1;
              }
            }
            else {
              local_e0 = 1;
            }
            RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&proxyIdx.m);
          }
          else {
            local_e0 = 1;
          }
        }
        else {
          local_e0 = 1;
        }
      }
      else {
        local_e0 = 1;
      }
      QMap<int,_QVariant>::~QMap(&local_d0);
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testItemDataTransParent()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = new ComplexModel(this);
    baseModel->insertRow(0);
    baseModel->insertColumn(0);
    const QModelIndex baseIdx = baseModel->index(0, 0);
    QVERIFY(baseModel->setData(baseIdx, 1, Qt::UserRole));
    QVERIFY(baseModel->setData(baseIdx, 2, Qt::UserRole + 1));
    auto itemData = baseModel->itemData(baseIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.addMaskedRole(Qt::UserRole + 1);
    proxyModel.addMaskedRole(Qt::UserRole + 2);
    const QModelIndex proxyIdx = proxyModel.index(0, 0);
    QVERIFY(proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2));
    proxyModel.setTransparentIfEmpty(true);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 3);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    proxyModel.setTransparentIfEmpty(false);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}